

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O2

bool ppmb_write_test(string *file_name)

{
  bool bVar1;
  uchar *r;
  uchar *g;
  uchar *b;
  string local_50;
  
  r = (uchar *)operator_new__(40000);
  g = (uchar *)operator_new__(40000);
  b = (uchar *)operator_new__(40000);
  ppmb_example(200,200,r,g,b);
  std::__cxx11::string::string((string *)&local_50,(string *)file_name);
  bVar1 = ppmb_write(&local_50,200,200,r,g,b);
  std::__cxx11::string::~string((string *)&local_50);
  operator_delete__(r);
  operator_delete__(g);
  operator_delete__(b);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"PPMB_WRITE_TEST: Fatal error!\n");
    std::operator<<((ostream *)&std::cout,"  PPMB_WRITE failed.\n");
  }
  return bVar1;
}

Assistant:

bool ppmb_write_test ( string file_name )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_WRITE_TEST tests the binary portable pixel map write routines.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    11 April 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, string FILE_NAME, the name of the file to contain the binary
//    portable pixel map data.
//
//    Output, bool PPMB_WRITE_TEST is true if an error occurred.
//
{
  unsigned char *b;
  bool error;
  unsigned char *g;
  int maxrgb;
  unsigned char *r;
  int xsize;
  int ysize;

  xsize = 200;
  ysize = 200;
//
//  Allocate memory.
// 
  r = new unsigned char[ xsize * ysize ];
  g = new unsigned char[ xsize * ysize ];
  b = new unsigned char[ xsize * ysize ];
//
//  Set the data.
//
  error = ppmb_example ( xsize, ysize, r, g, b );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE_TEST: Fatal error!\n";
    cout << "  PPM_EXAMPLE failed.\n";
    return true;
  }
//
//  Write the data to the file.
//
  error = ppmb_write ( file_name, xsize, ysize, r, g, b );

  delete [] r;
  delete [] g;
  delete [] b;

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE_TEST: Fatal error!\n";
    cout << "  PPMB_WRITE failed.\n";
    return true;
  }

  return false;
}